

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_parse_server_hello(mbedtls_ssl_context *ssl)

{
  int *minor;
  long lVar1;
  mbedtls_ssl_config *pmVar2;
  mbedtls_ssl_handshake_params *pmVar3;
  mbedtls_ssl_session *pmVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  ushort uVar10;
  ushort uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uchar *puVar15;
  mbedtls_ssl_ciphersuite_t *pmVar16;
  time_t tVar17;
  int *piVar18;
  ulong uVar19;
  byte bVar20;
  ulong uVar21;
  ulong uVar22;
  char *pcVar23;
  ushort *puVar24;
  uchar *puVar25;
  int major_ver;
  undefined4 uVar26;
  int local_38;
  int local_34;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
             ,0x582,"=> parse server hello");
  puVar25 = ssl->in_msg;
  iVar12 = mbedtls_ssl_read_record(ssl);
  if (iVar12 == 0) {
    if (ssl->in_msgtype != 0x16) {
      if (ssl->renego_status == 1) {
        iVar12 = ssl->renego_records_seen;
        ssl->renego_records_seen = iVar12 + 1;
        iVar14 = ssl->conf->renego_max_records;
        if (iVar12 < iVar14 || iVar14 < 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x59b,"non-handshake message during renego");
          return -0x6b00;
        }
        pcVar23 = "renegotiation requested, but not honored by server";
        iVar12 = 0x597;
      }
      else {
        pcVar23 = "bad server hello message";
        iVar12 = 0x5a0;
      }
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,iVar12,pcVar23);
      return -0x7700;
    }
    if ((ssl->conf->field_0x174 & 2) == 0) {
LAB_0011a824:
      uVar19 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8;
      if ((ssl->in_hslen < uVar19 + 0x2a) || (*puVar25 != '\x02')) {
        iVar12 = 0x5ba;
      }
      else {
        puVar25 = puVar25 + (uVar19 | 4);
        uVar26 = 0;
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x5cb,"server hello, version",puVar25,2);
        minor = &ssl->minor_ver;
        mbedtls_ssl_read_version
                  (&ssl->major_ver,minor,*(uint *)&ssl->conf->field_0x174 >> 1 & 1,puVar25);
        iVar12 = ssl->major_ver;
        pmVar2 = ssl->conf;
        if ((((iVar12 < (int)(uint)pmVar2->min_major_ver) ||
             (*minor < (int)(uint)pmVar2->min_minor_ver)) ||
            ((int)(uint)pmVar2->max_major_ver < iVar12)) ||
           ((int)(uint)pmVar2->max_minor_ver < *minor)) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x5d8,
                     "server version out of bounds -  min: [%d:%d], server: [%d:%d], max: [%d:%d]",
                     (ulong)pmVar2->min_major_ver,CONCAT44(uVar26,(uint)pmVar2->min_minor_ver),
                     iVar12,ssl->minor_ver,(uint)pmVar2->max_major_ver,(uint)pmVar2->max_minor_ver);
LAB_0011a92e:
          mbedtls_ssl_send_alert_message(ssl,'\x02','F');
          return -0x6e80;
        }
        uVar13 = *(uint *)(puVar25 + 2);
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x5e5,"server hello, current time: %lu",
                   (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                          uVar13 << 0x18));
        pmVar3 = ssl->handshake;
        uVar5 = *(undefined8 *)(puVar25 + 2);
        uVar6 = *(undefined8 *)(puVar25 + 10);
        uVar7 = *(undefined8 *)(puVar25 + 0x1a);
        *(undefined8 *)(pmVar3->randbytes + 0x30) = *(undefined8 *)(puVar25 + 0x12);
        *(undefined8 *)(pmVar3->randbytes + 0x38) = uVar7;
        *(undefined8 *)(pmVar3->randbytes + 0x20) = uVar5;
        *(undefined8 *)(pmVar3->randbytes + 0x28) = uVar6;
        bVar20 = puVar25[0x22];
        uVar19 = (ulong)bVar20;
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x5ec,"server hello, random bytes",puVar25 + 2,0x20);
        if (uVar19 < 0x21) {
          uVar22 = ssl->in_hslen;
          uVar21 = (ulong)((ssl->conf->field_0x174 & 2) >> 1);
          lVar1 = uVar21 * 8 + 4;
          if (uVar21 * 8 + 0x2b + uVar19 < uVar22) {
            uVar21 = (ulong)(ushort)(*(ushort *)(puVar25 + uVar19 + 0x26) << 8 |
                                    *(ushort *)(puVar25 + uVar19 + 0x26) >> 8);
            if ((uVar21 - 1 < 3) || (uVar22 != lVar1 + uVar19 + uVar21 + 0x28)) {
              iVar12 = 0x5fc;
            }
            else {
LAB_0011ac04:
              if (puVar25[uVar19 + 0x25] != '\0') {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x621,"server hello, bad compression: %d");
                return -0x7080;
              }
              uVar13 = (uint)(ushort)(*(ushort *)(puVar25 + uVar19 + 0x23) << 8 |
                                     *(ushort *)(puVar25 + uVar19 + 0x23) >> 8);
              pmVar16 = mbedtls_ssl_ciphersuite_from_id(uVar13);
              ssl->transform_negotiate->ciphersuite_info = pmVar16;
              if (pmVar16 == (mbedtls_ssl_ciphersuite_t *)0x0) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x62c,"ciphersuite info for %04x not found",uVar13);
                return -0x7100;
              }
              mbedtls_ssl_optimize_checksum(ssl,pmVar16);
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                         ,0x632,"server hello, session id len.: %d",uVar19);
              puVar15 = puVar25 + 0x23;
              mbedtls_debug_print_buf
                        (ssl,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                         ,0x633,"server hello, session id",puVar15,uVar19);
              pmVar3 = ssl->handshake;
              if ((((pmVar3->resume == 0) || (bVar20 == 0)) ||
                  ((ssl->renego_status != 0 ||
                   (((pmVar4 = ssl->session_negotiate, pmVar4->ciphersuite != uVar13 ||
                     (pmVar4->compression != 0)) || (pmVar4->id_len != uVar19)))))) ||
                 (iVar12 = bcmp(pmVar4->id,puVar15,uVar19), iVar12 != 0)) {
                ssl->state = ssl->state + 1;
                pmVar3->resume = 0;
                tVar17 = time((time_t *)0x0);
                pmVar4 = ssl->session_negotiate;
                pmVar4->start = tVar17;
                pmVar4->ciphersuite = uVar13;
                pmVar4->compression = 0;
                pmVar4->id_len = uVar19;
                memcpy(pmVar4->id,puVar15,uVar19);
              }
              else {
                ssl->state = 0xc;
                iVar12 = mbedtls_ssl_derive_keys(ssl);
                if (iVar12 != 0) {
                  pcVar23 = "mbedtls_ssl_derive_keys";
                  iVar14 = 0x651;
                  goto LAB_0011a621;
                }
              }
              pcVar23 = "a";
              if (ssl->handshake->resume == 0) {
                pcVar23 = "no";
              }
              iVar12 = 0x157798;
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                         ,0x657,"%s session has been resumed",pcVar23);
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                         ,0x659,"server hello, chosen ciphersuite: %04x",uVar13);
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                         ,0x65a,"server hello, compress alg.: %d",(ulong)puVar25[uVar19 + 0x25]);
              pmVar16 = mbedtls_ssl_ciphersuite_from_id(ssl->session_negotiate->ciphersuite);
              if ((pmVar16 != (mbedtls_ssl_ciphersuite_t *)0x0) &&
                 (((ssl->conf->field_0x174 & 0x40) == 0 ||
                  (pmVar16->cipher != MBEDTLS_CIPHER_ARC4_128)))) {
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x668,"server hello, chosen ciphersuite: %s",pmVar16->name);
                piVar18 = ssl->conf->ciphersuite_list[ssl->minor_ver];
                do {
                  iVar14 = *piVar18;
                  if (iVar14 == 0) {
                    iVar12 = 0x66f;
                    goto LAB_0011a965;
                  }
                  piVar18 = piVar18 + 1;
                } while (iVar14 != ssl->session_negotiate->ciphersuite);
                ssl->session_negotiate->compression = 0;
                puVar24 = (ushort *)(puVar25 + uVar19 + 0x28);
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x687,"server hello, total extension length: %d",uVar21);
                bVar9 = false;
                while (uVar21 != 0) {
                  uVar10 = puVar24[1] << 8 | puVar24[1] >> 8;
                  uVar22 = (ulong)(uVar10 + 4);
                  iVar14 = 0x692;
                  uVar19 = uVar21 - uVar22;
                  if (uVar21 < uVar22) {
LAB_0011af16:
                    bVar8 = false;
                    mbedtls_debug_print_msg
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                               ,iVar14,"bad server hello message");
                    uVar19 = uVar21;
                    iVar12 = -0x7980;
                  }
                  else {
                    uVar11 = *puVar24 << 8 | *puVar24 >> 8;
                    if (uVar11 < 0x16) {
                      if (uVar11 < 0xb) {
                        if (uVar11 != 1) {
                          if (uVar11 == 4) {
                            mbedtls_debug_print_msg
                                      (ssl,3,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                       ,0x6b3,"found truncated_hmac extension");
                            bVar20 = uVar10 == 0 & (byte)ssl->conf->field_0x175 >> 7;
                            iVar14 = -0x7980;
                            if (bVar20 == 1) {
                              ssl->session_negotiate->trunc_hmac = 1;
                              goto LAB_0011b259;
                            }
                            goto LAB_0011b25b;
                          }
LAB_0011b26e:
                          mbedtls_debug_print_msg
                                    (ssl,3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                     ,0x70d,"unknown extension found: %d (ignoring)");
                          goto LAB_0011b290;
                        }
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                   ,0x6a6,"found max_fragment_length extension");
                        iVar14 = -0x7980;
                        if (((uVar10 == 1) &&
                            (uVar13 = *(uint *)&ssl->conf->field_0x174 >> 7 & 7, uVar13 != 0)) &&
                           (iVar14 = -0x7980, uVar13 == (byte)puVar24[2])) {
                          iVar14 = 0;
                        }
                      }
                      else if (uVar11 == 0xb) {
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                   ,0x6e8,"found supported_point_formats extension");
                        iVar14 = ssl_parse_supported_point_formats_ext
                                           (ssl,(uchar *)(puVar24 + 2),(ulong)uVar10);
                      }
                      else {
                        if (uVar11 != 0x10) goto LAB_0011b26e;
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                   ,0x703,"found alpn extension");
                        iVar14 = ssl_parse_alpn_ext(ssl,(uchar *)(puVar24 + 2),(ulong)uVar10);
                      }
joined_r0x0011b209:
                      if (iVar14 == 0) {
LAB_0011b290:
                        puVar24 = (ushort *)((long)puVar24 + uVar22);
                        bVar8 = true;
                        iVar14 = 0x715;
                        uVar21 = uVar19;
                        if (uVar19 - 1 < 3) goto LAB_0011af16;
                        goto LAB_0011b2b5;
                      }
                    }
                    else {
                      uVar13 = (uint)uVar10;
                      if (uVar11 < 0x23) {
                        if (uVar11 == 0x16) {
                          bVar8 = false;
                          mbedtls_debug_print_msg
                                    (ssl,3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                     ,0x6c0,"found encrypt_then_mac extension");
                          iVar14 = -0x7980;
                          if ((((ssl->conf->field_0x175 & 4) != 0) && (bVar8 = false, uVar13 == 0))
                             && (*minor != 0)) {
                            ssl->session_negotiate->encrypt_then_mac = 1;
LAB_0011b1bb:
                            iVar14 = 0;
                            bVar8 = true;
                          }
                        }
                        else {
                          if (uVar11 != 0x17) goto LAB_0011b26e;
                          bVar8 = false;
                          mbedtls_debug_print_msg
                                    (ssl,3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                     ,0x6cd,"found extended_master_secret extension");
                          iVar14 = -0x7980;
                          if ((((ssl->conf->field_0x175 & 8) != 0) && (bVar8 = false, uVar13 == 0))
                             && (*minor != 0)) {
                            ssl->handshake->extended_ms = 1;
                            goto LAB_0011b1bb;
                          }
                        }
                        if (bVar8) goto LAB_0011b290;
                      }
                      else {
                        if (uVar11 != 0x23) {
                          if (uVar11 == 0xff01) {
                            mbedtls_debug_print_msg
                                      (ssl,3,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                       ,0x699,"found renegotiation extension");
                            iVar14 = ssl_parse_renegotiation_info
                                               (ssl,(uchar *)(puVar24 + 2),(ulong)uVar13);
                            bVar9 = true;
                            goto joined_r0x0011b209;
                          }
                          goto LAB_0011b26e;
                        }
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                   ,0x6da,"found session_ticket extension");
                        bVar20 = uVar13 == 0 & ssl->conf->field_0x176;
                        iVar14 = -0x7980;
                        if (bVar20 == 1) {
                          ssl->handshake->new_session_ticket = 1;
LAB_0011b259:
                          iVar14 = 0;
                        }
LAB_0011b25b:
                        if (bVar20 != 0) goto LAB_0011b290;
                      }
                    }
                    bVar8 = false;
                    uVar19 = uVar21;
                    iVar12 = iVar14;
                  }
LAB_0011b2b5:
                  uVar21 = uVar19;
                  if (!bVar8) {
                    return iVar12;
                  }
                }
                iVar12 = ssl->secure_renegotiation;
                if ((iVar12 == 0) && ((*(uint *)&ssl->conf->field_0x174 & 0x30) == 0x20)) {
                  pcVar23 = "legacy renegotiation, breaking off handshake";
                  iVar12 = 0x720;
                  goto LAB_0011b409;
                }
                if (ssl->renego_status == 1) {
                  if (iVar12 == 1 && !bVar9) {
                    pcVar23 = "renegotiation_info extension missing (secure)";
                    iVar12 = 0x728;
LAB_0011b409:
                    mbedtls_debug_print_msg
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                               ,iVar12,pcVar23);
                    iVar12 = mbedtls_ssl_send_fatal_handshake_failure(ssl);
                    if (iVar12 == 0) {
                      return -0x7980;
                    }
                    return iVar12;
                  }
                  if ((iVar12 == 0) && ((ssl->conf->field_0x174 & 0x30) == 0)) {
                    pcVar23 = "legacy renegotiation not allowed";
                    iVar12 = 0x72f;
                    goto LAB_0011b409;
                  }
                  if (iVar12 == 0 && bVar9) {
                    pcVar23 = "renegotiation_info extension present (legacy)";
                    iVar12 = 0x736;
                    goto LAB_0011b409;
                  }
                }
                pcVar23 = "<= parse server hello";
                iVar12 = 0x743;
LAB_0011aaa0:
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,iVar12,pcVar23);
                return 0;
              }
              iVar12 = 0x664;
            }
          }
          else {
            if (uVar22 == lVar1 + uVar19 + 0x26) {
              uVar21 = 0;
              goto LAB_0011ac04;
            }
            iVar12 = 0x606;
          }
        }
        else {
          iVar12 = 0x5f0;
        }
      }
LAB_0011a965:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,iVar12,"bad server hello message");
    }
    else {
      if (*puVar25 != '\x03') {
        free(ssl->handshake->verify_cookie);
        pmVar3 = ssl->handshake;
        pmVar3->verify_cookie = (uchar *)0x0;
        pmVar3->verify_cookie_len = '\0';
        goto LAB_0011a824;
      }
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x5a9,"received hello verify request");
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x5aa,"<= parse server hello");
      puVar25 = ssl->in_msg;
      uVar13 = *(uint *)&ssl->conf->field_0x174 & 2;
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x52e,"=> parse hello verify request");
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x536,"server version",puVar25 + (ulong)uVar13 * 4 + 4,2);
      mbedtls_ssl_read_version
                (&local_34,&local_38,*(uint *)&ssl->conf->field_0x174 >> 1 & 1,
                 puVar25 + (ulong)uVar13 * 4 + 4);
      if (((local_38 < 2 || local_34 < 3) || ((int)(uint)ssl->conf->max_major_ver < local_34)) ||
         ((int)(uint)ssl->conf->max_minor_ver < local_38)) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x543,"bad server version");
        goto LAB_0011a92e;
      }
      bVar20 = puVar25[(ulong)uVar13 * 4 + 6];
      puVar25 = puVar25 + (ulong)uVar13 * 4 + 7;
      uVar19 = (ulong)bVar20;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x54c,"cookie",puVar25,uVar19);
      if ((long)uVar19 <= (long)(ssl->in_msg + (ssl->in_msglen - (long)puVar25))) {
        free(ssl->handshake->verify_cookie);
        puVar15 = (uchar *)calloc(1,uVar19);
        pmVar3 = ssl->handshake;
        pmVar3->verify_cookie = puVar15;
        if (puVar15 == (uchar *)0x0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x55c,"alloc failed (%d bytes)",uVar19);
          return -0x7f00;
        }
        memcpy(puVar15,puVar25,uVar19);
        pmVar3->verify_cookie_len = bVar20;
        ssl->state = 1;
        mbedtls_ssl_reset_checksum(ssl);
        mbedtls_ssl_recv_flight_completed(ssl);
        pcVar23 = "<= parse hello verify request";
        iVar12 = 0x569;
        goto LAB_0011aaa0;
      }
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x551,"cookie length does not match incoming message size");
      mbedtls_ssl_send_alert_message(ssl,'\x02','2');
    }
    iVar12 = -0x7980;
  }
  else {
    pcVar23 = "mbedtls_ssl_read_record";
    iVar14 = 0x588;
LAB_0011a621:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,iVar14,pcVar23,iVar12);
  }
  return iVar12;
}

Assistant:

static int ssl_parse_server_hello( mbedtls_ssl_context *ssl )
{
    int ret, i;
    size_t n;
    size_t ext_len;
    unsigned char *buf, *ext;
    unsigned char comp;
#if defined(MBEDTLS_ZLIB_SUPPORT)
    int accept_comp;
#endif
#if defined(MBEDTLS_SSL_RENEGOTIATION)
    int renegotiation_info_seen = 0;
#endif
    int handshake_failure = 0;
    const mbedtls_ssl_ciphersuite_t *suite_info;
#if defined(MBEDTLS_DEBUG_C)
    uint32_t t;
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse server hello" ) );

    buf = ssl->in_msg;

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        if( ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS )
        {
            ssl->renego_records_seen++;

            if( ssl->conf->renego_max_records >= 0 &&
                ssl->renego_records_seen > ssl->conf->renego_max_records )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "renegotiation requested, "
                                    "but not honored by server" ) );
                return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
            }

            MBEDTLS_SSL_DEBUG_MSG( 1, ( "non-handshake message during renego" ) );
            return( MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO );
        }
#endif /* MBEDTLS_SSL_RENEGOTIATION */

        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        if( buf[0] == MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "received hello verify request" ) );
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse server hello" ) );
            return( ssl_parse_hello_verify_request( ssl ) );
        }
        else
        {
            /* We made it through the verification process */
            mbedtls_free( ssl->handshake->verify_cookie );
            ssl->handshake->verify_cookie = NULL;
            ssl->handshake->verify_cookie_len = 0;
        }
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

    if( ssl->in_hslen < 38 + mbedtls_ssl_hs_hdr_len( ssl ) ||
        buf[0] != MBEDTLS_SSL_HS_SERVER_HELLO )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    /*
     *  0   .  1    server_version
     *  2   . 33    random (maybe including 4 bytes of Unix time)
     * 34   . 34    session_id length = n
     * 35   . 34+n  session_id
     * 35+n . 36+n  cipher_suite
     * 37+n . 37+n  compression_method
     *
     * 38+n . 39+n  extensions length (optional)
     * 40+n .  ..   extensions
     */
    buf += mbedtls_ssl_hs_hdr_len( ssl );

    MBEDTLS_SSL_DEBUG_BUF( 3, "server hello, version", buf + 0, 2 );
    mbedtls_ssl_read_version( &ssl->major_ver, &ssl->minor_ver,
                      ssl->conf->transport, buf + 0 );

    if( ssl->major_ver < ssl->conf->min_major_ver ||
        ssl->minor_ver < ssl->conf->min_minor_ver ||
        ssl->major_ver > ssl->conf->max_major_ver ||
        ssl->minor_ver > ssl->conf->max_minor_ver )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server version out of bounds - "
                            " min: [%d:%d], server: [%d:%d], max: [%d:%d]",
                            ssl->conf->min_major_ver, ssl->conf->min_minor_ver,
                            ssl->major_ver, ssl->minor_ver,
                            ssl->conf->max_major_ver, ssl->conf->max_minor_ver ) );

        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                     MBEDTLS_SSL_ALERT_MSG_PROTOCOL_VERSION );

        return( MBEDTLS_ERR_SSL_BAD_HS_PROTOCOL_VERSION );
    }

#if defined(MBEDTLS_DEBUG_C)
    t = ( (uint32_t) buf[2] << 24 )
      | ( (uint32_t) buf[3] << 16 )
      | ( (uint32_t) buf[4] <<  8 )
      | ( (uint32_t) buf[5]       );
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, current time: %lu", t ) );
#endif

    memcpy( ssl->handshake->randbytes + 32, buf + 2, 32 );

    n = buf[34];

    MBEDTLS_SSL_DEBUG_BUF( 3,   "server hello, random bytes", buf + 2, 32 );

    if( n > 32 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    if( ssl->in_hslen > mbedtls_ssl_hs_hdr_len( ssl ) + 39 + n )
    {
        ext_len = ( ( buf[38 + n] <<  8 )
                  | ( buf[39 + n]       ) );

        if( ( ext_len > 0 && ext_len < 4 ) ||
            ssl->in_hslen != mbedtls_ssl_hs_hdr_len( ssl ) + 40 + n + ext_len )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
        }
    }
    else if( ssl->in_hslen == mbedtls_ssl_hs_hdr_len( ssl ) + 38 + n )
    {
        ext_len = 0;
    }
    else
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    /* ciphersuite (used later) */
    i = ( buf[35 + n] << 8 ) | buf[36 + n];

    /*
     * Read and check compression
     */
    comp = buf[37 + n];

#if defined(MBEDTLS_ZLIB_SUPPORT)
    /* See comments in ssl_write_client_hello() */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        accept_comp = 0;
    else
#endif
        accept_comp = 1;

    if( comp != MBEDTLS_SSL_COMPRESS_NULL &&
        ( comp != MBEDTLS_SSL_COMPRESS_DEFLATE || accept_comp == 0 ) )
#else /* MBEDTLS_ZLIB_SUPPORT */
    if( comp != MBEDTLS_SSL_COMPRESS_NULL )
#endif/* MBEDTLS_ZLIB_SUPPORT */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server hello, bad compression: %d", comp ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    /*
     * Initialize update checksum functions
     */
    ssl->transform_negotiate->ciphersuite_info = mbedtls_ssl_ciphersuite_from_id( i );

    if( ssl->transform_negotiate->ciphersuite_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "ciphersuite info for %04x not found", i ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    mbedtls_ssl_optimize_checksum( ssl, ssl->transform_negotiate->ciphersuite_info );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, session id len.: %d", n ) );
    MBEDTLS_SSL_DEBUG_BUF( 3,   "server hello, session id", buf + 35, n );

    /*
     * Check if the session can be resumed
     */
    if( ssl->handshake->resume == 0 || n == 0 ||
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        ssl->renego_status != MBEDTLS_SSL_INITIAL_HANDSHAKE ||
#endif
        ssl->session_negotiate->ciphersuite != i ||
        ssl->session_negotiate->compression != comp ||
        ssl->session_negotiate->id_len != n ||
        memcmp( ssl->session_negotiate->id, buf + 35, n ) != 0 )
    {
        ssl->state++;
        ssl->handshake->resume = 0;
#if defined(MBEDTLS_HAVE_TIME)
        ssl->session_negotiate->start = mbedtls_time( NULL );
#endif
        ssl->session_negotiate->ciphersuite = i;
        ssl->session_negotiate->compression = comp;
        ssl->session_negotiate->id_len = n;
        memcpy( ssl->session_negotiate->id, buf + 35, n );
    }